

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

bool __thiscall QCalendarWidget::eventFilter(QCalendarWidget *this,QObject *watched,QEvent *event)

{
  QCalendarWidgetPrivate *this_00;
  bool bVar1;
  undefined1 uVar2;
  char cVar3;
  QWidget *parent;
  QWidget *pQVar4;
  QPoint QVar5;
  QSize QVar6;
  long in_FS_OFFSET;
  QPointF local_58;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 2) {
    this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
    bVar1 = QWidget::hasFocus((QWidget *)this_00->yearEdit);
    if (!bVar1) goto LAB_003a8d93;
    parent = QWidget::window(&this->super_QWidget);
    if ((watched == (QObject *)0x0) || ((*(byte *)(*(long *)(watched + 8) + 0x30) & 1) == 0)) {
LAB_003a8cca:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar2 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
        return (bool)uVar2;
      }
      goto LAB_003a8dd9;
    }
    pQVar4 = QWidget::window((QWidget *)watched);
    if (pQVar4 != parent) goto LAB_003a8cca;
    local_58 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_48 = QPointF::toPoint(&local_58);
    local_40 = QWidget::mapTo((QWidget *)watched,parent,&local_48);
    local_48.xp.m_i = 0;
    local_48.yp.m_i = 0;
    QVar5 = QWidget::mapTo((QWidget *)this_00->yearEdit,parent,&local_48);
    QVar6 = QWidget::size((QWidget *)this_00->yearEdit);
    local_58.yp._0_4_ = QVar6.wd.m_i.m_i + QVar5.xp.m_i.m_i + -1;
    local_58.xp = (qreal)QVar5;
    local_58.yp._4_4_ = QVar5.yp.m_i.m_i + -1 + QVar6.ht.m_i.m_i;
    cVar3 = QRect::contains((QPoint *)&local_58,SUB81(&local_40,0));
    if (cVar3 != '\0') goto LAB_003a8d93;
    event[0xc] = (QEvent)0x1;
    QCalendarWidgetPrivate::_q_yearEditingFinished(this_00);
    QWidget::setFocus(&this->super_QWidget);
    uVar2 = 1;
  }
  else {
LAB_003a8d93:
    uVar2 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
LAB_003a8dd9:
  __stack_chk_fail();
}

Assistant:

bool QCalendarWidget::eventFilter(QObject *watched, QEvent *event)
{
    Q_D(QCalendarWidget);
    if (event->type() == QEvent::MouseButtonPress && d->yearEdit->hasFocus()) {
        // We can get filtered press events that were intended for Qt Virtual Keyboard's
        // input panel (QQuickView), so we have to make sure that the window is indeed a QWidget - no static_cast.
        // In addition, as we have a event filter on the whole application we first make sure that the top level widget
        // of both this and the watched widget are the same to decide if we should finish the year edition.
        QWidget *tlw = window();
        QWidget *widget = qobject_cast<QWidget *>(watched);
        if (!widget || widget->window() != tlw)
            return QWidget::eventFilter(watched, event);

        QPoint mousePos = widget->mapTo(tlw, static_cast<QMouseEvent *>(event)->position().toPoint());
        QRect geom = QRect(d->yearEdit->mapTo(tlw, QPoint(0, 0)), d->yearEdit->size());
        if (!geom.contains(mousePos)) {
            event->accept();
            d->_q_yearEditingFinished();
            setFocus();
            return true;
        }
    }
    return QWidget::eventFilter(watched, event);
}